

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

LY_ERR lys_compile_when(lysc_ctx *ctx,lysp_when *when_p,uint16_t inherited_flags,lysc_node *parent,
                       lysc_node *ctx_node,lysc_node *node,lysc_when **when_c)

{
  LY_ERR LVar1;
  lysc_when **pplVar2;
  undefined8 *local_60;
  char *p__;
  lysc_when *ptr;
  lysc_when ***node_when;
  lysc_when **new_when;
  lysc_node *plStack_38;
  LY_ERR rc;
  lysc_node *node_local;
  lysc_node *ctx_node_local;
  lysc_node *parent_local;
  lysp_when *plStack_18;
  uint16_t inherited_flags_local;
  lysp_when *when_p_local;
  lysc_ctx *ctx_local;
  
  new_when._4_4_ = LY_SUCCESS;
  plStack_38 = node;
  node_local = ctx_node;
  ctx_node_local = parent;
  parent_local._6_2_ = inherited_flags;
  plStack_18 = when_p;
  when_p_local = (lysp_when *)ctx;
  if ((when_p != (lysp_when *)0x0) && ((node != (lysc_node *)0x0 || (when_c != (lysc_when **)0x0))))
  {
    if (node == (lysc_node *)0x0) {
      node_when = (lysc_when ***)&p__;
      pplVar2 = (lysc_when **)calloc(1,0x38);
      *node_when = pplVar2;
      if (*node_when == (lysc_when **)0x0) {
        ly_log((ly_ctx *)when_p_local->cond,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lys_compile_when");
        return LY_EMEM;
      }
    }
    else {
      ptr = (lysc_when *)lysc_node_when_p(node);
      if (ptr->cond == (lyxp_expr *)0x0) {
        local_60 = (undefined8 *)malloc(0x10);
        if (local_60 == (undefined8 *)0x0) {
          ly_log((ly_ctx *)when_p_local->cond,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_compile_when");
          return LY_EMEM;
        }
        *local_60 = 1;
      }
      else {
        ptr->cond[-1].expr = ptr->cond[-1].expr + 1;
        local_60 = (undefined8 *)realloc(&ptr->cond[-1].expr,(long)ptr->cond[-1].expr * 8 + 8);
        if (local_60 == (undefined8 *)0x0) {
          ptr->cond[-1].expr = ptr->cond[-1].expr + -1;
          ly_log((ly_ctx *)when_p_local->cond,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_compile_when");
          return LY_EMEM;
        }
      }
      ptr->cond = (lyxp_expr *)(local_60 + 1);
      node_when = (lysc_when ***)(&ptr->cond->tokens + (long)(ptr->cond[-1].expr + -1));
      memset(node_when,0,8);
    }
    if ((when_c == (lysc_when **)0x0) || (*when_c == (lysc_when *)0x0)) {
      LVar1 = lys_compile_when_((lysc_ctx *)when_p_local,plStack_18,parent_local._6_2_,
                                ctx_node_local,node_local,(lysc_when **)node_when);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      new_when._4_4_ = LY_SUCCESS;
      if (when_c != (lysc_when **)0x0) {
        *when_c = (lysc_when *)*node_when;
      }
    }
    else {
      (*when_c)->refcount = (*when_c)->refcount + 1;
      *node_when = (lysc_when **)*when_c;
    }
    if (plStack_38 != (lysc_node *)0x0) {
      new_when._4_4_ =
           lysc_unres_when_add((lysc_ctx *)when_p_local,(lysc_when *)*node_when,plStack_38);
    }
    return new_when._4_4_;
  }
  __assert_fail("when_p && (node || when_c)",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                ,0x20a,
                "LY_ERR lys_compile_when(struct lysc_ctx *, const struct lysp_when *, uint16_t, const struct lysc_node *, const struct lysc_node *, struct lysc_node *, struct lysc_when **)"
               );
}

Assistant:

LY_ERR
lys_compile_when(struct lysc_ctx *ctx, const struct lysp_when *when_p, uint16_t inherited_flags, const struct lysc_node *parent,
        const struct lysc_node *ctx_node, struct lysc_node *node, struct lysc_when **when_c)
{
    LY_ERR rc = LY_SUCCESS;
    struct lysc_when **new_when, ***node_when, *ptr;

    assert(when_p && (node || when_c));

    if (node) {
        /* get the when array */
        node_when = lysc_node_when_p(node);

        /* create new when pointer */
        LY_ARRAY_NEW_GOTO(ctx->ctx, *node_when, new_when, rc, cleanup);
    } else {
        /* individual when */
        new_when = &ptr;
        *new_when = calloc(1, sizeof **new_when);
        LY_CHECK_ERR_GOTO(!*new_when, LOGMEM(ctx->ctx); rc = LY_EMEM, cleanup);
    }

    if (!when_c || !(*when_c)) {
        /* compile when */
        LY_CHECK_GOTO(rc = lys_compile_when_(ctx, when_p, inherited_flags, parent, ctx_node, new_when), cleanup);

        /* remember the compiled when for sharing */
        if (when_c) {
            *when_c = *new_when;
        }
    } else {
        /* use the previously compiled when */
        ++(*when_c)->refcount;
        *new_when = *when_c;
    }

    if (node) {
        /* add when to unres if there is a node for evaluation (not for extension instances) */
        LY_CHECK_GOTO(rc = lysc_unres_when_add(ctx, *new_when, node), cleanup);
    }

cleanup:
    return rc;
}